

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codacheck.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  int *piVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  char filename [1000];
  char local_418 [1000];
  
  option_verbose = 0;
  option_quick = 0;
  option_require_definition = 0;
  if (argc != 1) {
    pcVar1 = argv[1];
    iVar4 = strcmp(pcVar1,"-h");
    if ((iVar4 != 0) && (iVar4 = strcmp(pcVar1,"--help"), iVar4 != 0)) {
      iVar4 = strcmp(pcVar1,"-v");
      if ((iVar4 != 0) && (iVar4 = strcmp(pcVar1,"--version"), iVar4 != 0)) {
        if ((argc < 3) || (iVar4 = strcmp(pcVar1,"-D"), iVar4 != 0)) {
          iVar4 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
          uVar8 = 1;
          if (iVar4 != 0) {
            main_cold_1();
            puts("Usage:");
            puts("    codacheck [-D definitionpath] [<options>] <files>");
            puts("        Provide a basic sanity check on product files supported by CODA");
            puts("        Options:");
            puts("            -d, --definition");
            puts("                    require products to have a definition in a codadef file,");
            puts("                    return an error and abort verification otherwise");
            puts("                    (affects products using formats such as xml/netcdf/hdf)");
            puts("            -q, --quick");
            puts("                    only perform a quick check of the product");
            puts("                    (do not traverse the full product)");
            puts("            -V, --verbose");
            puts("                    show more information while performing the check");
            puts("            --no-mmap");
            puts("                    disable the use of mmap when opening files");
            putchar(10);
            puts("        If you pass a \'-\' for the <files> section then the list of files will");
            puts("        be read from stdin.");
            putchar(10);
            puts("    codacheck -h, --help");
            puts("        Show help (this text)");
            putchar(10);
            puts("    codacheck -v, --version");
            puts("        Print the version number of CODA and exit");
            putchar(10);
            puts("    CODA will look for .codadef files using a definition path, which is a \':\'");
            puts("    separated (\';\' on Windows) list of paths to .codadef files and/or to");
            puts("    directories containing .codadef files.");
            puts("    By default the definition path is set to a single directory relative to");
            puts("    the tool location. A different definition path can be set via the");
            puts("    CODA_DEFINITION environment variable or via the -D option.");
            puts("    (the -D option overrides the environment variable setting).");
            iVar4 = putchar(10);
            return iVar4;
          }
        }
        else {
          coda_set_definition_path(argv[2]);
          uVar8 = 3;
        }
        bVar2 = true;
        uVar6 = 1;
        if ((int)uVar8 < argc) {
          do {
            pcVar1 = argv[uVar8];
            iVar4 = strcmp(pcVar1,"-V");
            piVar5 = &option_verbose;
            if (iVar4 == 0) {
LAB_00101519:
              *piVar5 = 1;
              uVar3 = uVar6;
            }
            else {
              iVar4 = strcmp(pcVar1,"--verbose");
              piVar5 = &option_verbose;
              if (iVar4 == 0) goto LAB_00101519;
              iVar4 = strcmp(pcVar1,"-q");
              piVar5 = &option_quick;
              if (iVar4 == 0) goto LAB_00101519;
              iVar4 = strcmp(pcVar1,"--quick");
              piVar5 = &option_quick;
              if (iVar4 == 0) goto LAB_00101519;
              iVar4 = strcmp(pcVar1,"-d");
              piVar5 = &option_require_definition;
              if (iVar4 == 0) goto LAB_00101519;
              iVar4 = strcmp(pcVar1,"--definition");
              piVar5 = &option_require_definition;
              if (iVar4 == 0) goto LAB_00101519;
              iVar4 = strcmp(pcVar1,"--no-mmap");
              uVar3 = 0;
              if (iVar4 != 0) {
                iVar4 = strcmp(pcVar1,"-");
                if ((int)uVar8 == argc + -1 && iVar4 == 0) {
                  bVar2 = false;
                  goto LAB_00101539;
                }
                if (*pcVar1 == '-') {
                  main_cold_2();
                  goto LAB_001016cc;
                }
                break;
              }
            }
            uVar6 = uVar3;
            uVar8 = uVar8 + 1;
          } while ((uint)argc != uVar8);
          bVar2 = true;
        }
LAB_00101539:
        iVar4 = coda_init();
        if (iVar4 == 0) {
          coda_set_option_perform_boundary_checks(0);
          coda_set_option_perform_conversions(0);
          coda_set_option_use_mmap(uVar6);
          if (bVar2) {
            if ((int)uVar8 < argc) {
              uVar8 = uVar8 & 0xffffffff;
              do {
                check_file(argv[uVar8]);
                fflush((FILE *)0x0);
                uVar8 = uVar8 + 1;
              } while ((uint)argc != uVar8);
            }
          }
          else {
            uVar8 = 0;
            do {
              while( true ) {
                iVar4 = getchar();
                iVar7 = iVar4 << 0x18;
                if ((iVar7 == -0x1000000) || (iVar7 == 0xa000000)) break;
                if (iVar7 == 0xd000000) {
                  iVar4 = getchar();
                  if (iVar4 << 0x18 != 0xa000000) {
                    ungetc((iVar4 << 0x18) >> 0x18,_stdin);
                  }
                  break;
                }
                local_418[uVar8] = (char)iVar4;
                uVar8 = uVar8 + 1;
                if (uVar8 == 1000) {
                  __assert_fail("k < 1000",
                                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/tools/codacheck/codacheck.c"
                                ,0x139,"int main(int, char **)");
                }
              }
              local_418[uVar8 & 0xffffffff] = '\0';
              if (uVar8 != 0) {
                check_file(local_418);
                fflush((FILE *)0x0);
              }
              uVar8 = 0;
            } while (iVar7 != -0x1000000);
          }
          coda_done();
          if (found_errors == 0) {
            return 0;
          }
        }
        else {
          main_cold_3();
        }
        exit(1);
      }
      print_version();
      goto LAB_001016d8;
    }
  }
LAB_001016cc:
  print_help();
LAB_001016d8:
  exit(0);
}

Assistant:

int main(int argc, char *argv[])
{
    int option_stdin;
    int option_use_mmap;
    int i;

    option_stdin = 0;
    option_verbose = 0;
    option_quick = 0;
    option_use_mmap = 1;
    option_require_definition = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-V") == 0 || strcmp(argv[i], "--verbose") == 0)
        {
            option_verbose = 1;
        }
        else if (strcmp(argv[i], "-q") == 0 || strcmp(argv[i], "--quick") == 0)
        {
            option_quick = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--definition") == 0)
        {
            option_require_definition = 1;
        }
        else if (strcmp(argv[i], "--no-mmap") == 0)
        {
            option_use_mmap = 0;
        }
        else if (strcmp(argv[i], "-") == 0 && i == argc - 1)
        {
            option_stdin = 1;
            break;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are files */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    if (coda_init() != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }

    /* The codacheck program should never navigate beyond the array bounds.
     * We therefore disable to boundary check option to increase performance.
     * Mind that this option does not influence the out-of-bounds check that CODA performs to ensure
     * that a read is performed using a byte offset/size that is within the limits of the total file size.
     */
    coda_set_option_perform_boundary_checks(0);

    /* We disable conversions since this speeds up the check of reading all numerical data */
    coda_set_option_perform_conversions(0);

    /* Set mmap based on the chosen option */
    coda_set_option_use_mmap(option_use_mmap);

    if (option_stdin)
    {
        char filename[1000];
        char c;

        do
        {
            int k;

            k = 0;
            for (;;)
            {
                c = getchar();
                if (c == '\r')
                {
                    char c2;

                    c2 = getchar();
                    /* test for '\r\n' combination */
                    if (c2 != '\n')
                    {
                        /* if the second char is not '\n' put it back in the read buffer */
                        ungetc(c2, stdin);
                    }
                }
                if (c == EOF || c == '\n' || c == '\r')
                {
                    filename[k] = '\0';
                    break;
                }
                filename[k] = c;
                k++;
                assert(k < 1000);
            }
            if (k > 0)
            {
                check_file(filename);
                fflush(NULL);
            }
        } while (c != EOF);
    }
    else
    {
        while (i < argc)
        {
            check_file(argv[i]);
            fflush(NULL);
            i++;
        }
    }

    coda_done();

    if (found_errors)
    {
        exit(1);
    }

    return 0;
}